

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O0

void __thiscall
wasm::OptimizationOptions::PassInfo::PassInfo
          (PassInfo *this,string *name,int optimizeLevel,int shrinkLevel)

{
  int local_20;
  int local_1c;
  int shrinkLevel_local;
  int optimizeLevel_local;
  string *name_local;
  PassInfo *this_local;
  
  local_20 = shrinkLevel;
  local_1c = optimizeLevel;
  _shrinkLevel_local = name;
  name_local = &this->name;
  std::__cxx11::string::string((string *)this,(string *)name);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->argument);
  std::optional<int>::optional<int_&,_true>(&this->optimizeLevel,&local_1c);
  std::optional<int>::optional<int_&,_true>(&this->shrinkLevel,&local_20);
  return;
}

Assistant:

PassInfo(std::string name, int optimizeLevel, int shrinkLevel)
      : name(name), optimizeLevel(optimizeLevel), shrinkLevel(shrinkLevel) {}